

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uiter.cpp
# Opt level: O1

int32_t utf8IteratorMove(UCharIterator *iter,int32_t delta,UCharIteratorOrigin origin)

{
  int32_t *piVar1;
  uint uVar2;
  uint8_t *s;
  int iVar3;
  uint uVar4;
  byte bVar5;
  int iVar6;
  int32_t *piVar7;
  uint uVar8;
  ulong uVar9;
  uint uVar10;
  long lVar11;
  ulong uVar12;
  byte bVar13;
  bool bVar14;
  int32_t i;
  uint local_2c;
  
  switch(origin) {
  case UITER_START:
  case UITER_ZERO:
    bVar5 = 0;
    iVar3 = delta;
    break;
  case UITER_CURRENT:
    iVar6 = iter->index;
    bVar5 = (byte)((uint)iVar6 >> 0x1f);
    iVar3 = 0;
    if (-1 < iVar6) {
      iVar3 = iVar6 + delta;
    }
    break;
  case UITER_LIMIT:
  case UITER_LENGTH:
    if (iter->length < 0) {
      iter->index = -1;
      iter->start = iter->limit;
      iter->reservedField = 0;
      if (-1 < delta) {
        return -2;
      }
      bVar5 = 1;
      iVar3 = 0;
    }
    else {
      bVar5 = 0;
      iVar3 = iter->length + delta;
    }
    break;
  default:
    return -1;
  }
  if (bVar5 != 0) {
    if (delta == 0) {
      return -2;
    }
    iVar3 = iter->start;
    if (iVar3 == -delta || SBORROW4(iVar3,-delta) != iVar3 + delta < 0) {
LAB_00355c83:
      iter->reservedField = 0;
      iter->start = 0;
      iter->index = 0;
      return 0;
    }
    if (iter->limit - iVar3 <= delta) {
      iVar3 = iter->length;
      iter->index = iVar3;
      iter->start = iter->limit;
      iter->reservedField = 0;
      if (iVar3 < 0) {
        return -2;
      }
      return iVar3;
    }
    goto LAB_00355cf2;
  }
  if (iVar3 < 1) goto LAB_00355c83;
  iVar6 = iter->length;
  if ((-1 < iVar6) && (iVar6 <= iVar3)) {
    iter->index = iVar6;
    iter->start = iter->limit;
    iter->reservedField = 0;
    return iVar6;
  }
  piVar1 = &iter->index;
  uVar4 = *piVar1;
  if (((int)uVar4 < 0) || (iVar3 < (int)(uVar4 >> 1))) {
    iter->reservedField = 0;
    iter->start = 0;
    piVar7 = piVar1;
LAB_00355cdf:
    *piVar7 = 0;
  }
  else if ((-1 < iVar6) && (iVar6 - iVar3 < (int)(iVar3 - uVar4))) {
    iter->index = iVar6;
    iter->start = iter->limit;
    piVar7 = &iter->reservedField;
    goto LAB_00355cdf;
  }
  delta = iVar3 - *piVar1;
  if (delta == 0) {
    return *piVar1;
  }
LAB_00355cf2:
  s = (uint8_t *)iter->context;
  uVar4 = iter->index;
  local_2c = iter->start;
  if (delta < 1) {
    if (iter->reservedField != 0) {
      iter->reservedField = 0;
      local_2c = local_2c - 4;
      uVar4 = uVar4 - 1;
      delta = delta + 1;
    }
    uVar8 = uVar4;
    if (0 < (int)local_2c && delta < 0) {
      do {
        local_2c = local_2c - 1;
        bVar5 = s[local_2c];
        uVar4 = (uint)bVar5;
        if ((char)bVar5 < '\0') {
          uVar4 = utf8_prevCharSafeBody_63(s,0,(int32_t *)&local_2c,(uint)bVar5,-3);
        }
        if ((int)uVar4 < 0x10000) {
          iVar3 = 1;
          iVar6 = -1;
        }
        else {
          if (-2 < delta) {
            local_2c = local_2c + 4;
            iter->reservedField = uVar4;
            uVar8 = uVar8 - 1;
            break;
          }
          iVar3 = 2;
          iVar6 = -2;
        }
        uVar8 = uVar8 + iVar6;
        delta = delta + iVar3;
        if ((-1 < delta) || ((int)local_2c < 1)) break;
      } while( true );
    }
  }
  else {
    uVar2 = iter->limit;
    uVar8 = uVar4;
    if (iter->reservedField != 0) {
      iter->reservedField = 0;
      delta = delta + -1;
      uVar8 = uVar4 + 1;
    }
    uVar9 = (ulong)local_2c;
    if ((int)local_2c < (int)uVar2 && 0 < delta) {
      do {
        lVar11 = (long)(int)uVar9;
        uVar9 = lVar11 + 1;
        local_2c = (uint)uVar9;
        bVar5 = s[lVar11];
        uVar10 = (uint)bVar5;
        if ((char)bVar5 < '\0') {
          if (local_2c != uVar2) {
            if (bVar5 < 0xe0) {
              if (0xc1 < bVar5) {
                uVar10 = uVar10 & 0x1f;
LAB_00355ea1:
                if ((byte)(s[(int)uVar9] ^ 0x80) < 0x40) {
                  uVar10 = uVar10 << 6 | s[(int)uVar9] ^ 0x80;
                  local_2c = (int)uVar9 + 1;
                  uVar9 = (ulong)local_2c;
                  goto LAB_00355e0c;
                }
              }
            }
            else if (bVar5 < 0xf0) {
              uVar10 = uVar10 & 0xf;
              if (((byte)" 000000000000\x1000"[uVar10] >> (s[uVar9] >> 5) & 1) != 0) {
                bVar13 = s[uVar9] & 0x3f;
LAB_00355e79:
                local_2c = (int)uVar9 + 1;
                uVar9 = (ulong)local_2c;
                if (local_2c != uVar2) {
                  uVar10 = (uint)bVar13 | uVar10 << 6;
                  goto LAB_00355ea1;
                }
              }
            }
            else if (bVar5 < 0xf5) {
              if (((uint)(int)""[s[uVar9] >> 4] >> (bVar5 - 0xf0 & 0x1f) & 1) != 0) {
                uVar12 = lVar11 + 2;
                local_2c = (uint)uVar12;
                if ((local_2c != uVar2) && (bVar13 = s[uVar12] + 0x80, bVar13 < 0x40)) {
                  uVar10 = s[uVar9] & 0x3f | (bVar5 - 0xf0) * 0x40;
                  uVar9 = uVar12 & 0xffffffff;
                  goto LAB_00355e79;
                }
                uVar9 = uVar12 & 0xffffffff;
              }
            }
          }
          uVar10 = 0xfffd;
        }
LAB_00355e0c:
        if ((int)uVar10 < 0x10000) {
          iVar3 = -1;
          iVar6 = 1;
        }
        else {
          if (delta < 2) {
            iter->reservedField = uVar10;
            uVar8 = uVar8 + 1;
            break;
          }
          iVar3 = -2;
          iVar6 = 2;
        }
        uVar8 = uVar8 + iVar6;
        bVar14 = SCARRY4(delta,iVar3);
        delta = delta + iVar3;
        if ((delta == 0 || bVar14 != delta < 0) || ((int)uVar2 <= (int)uVar9)) break;
      } while( true );
    }
    if (local_2c == uVar2) {
      iVar3 = iter->length;
      if ((int)uVar4 < 0 || -1 < iVar3) {
        if (-1 < iVar3 && (int)uVar4 < 0) {
          iter->index = iVar3 + -1 + (uint)(iter->reservedField == 0);
        }
      }
      else {
        iter->length = (uVar8 + 1) - (uint)(iter->reservedField == 0);
      }
    }
  }
  iter->start = local_2c;
  if (iter->index < 0) {
    uVar8 = 0xfffffffe;
    if ((int)local_2c < 2) {
      iter->index = local_2c;
      uVar8 = local_2c;
    }
  }
  else {
    iter->index = uVar8;
  }
  return uVar8;
}

Assistant:

static int32_t U_CALLCONV
utf8IteratorMove(UCharIterator *iter, int32_t delta, UCharIteratorOrigin origin) {
    const uint8_t *s;
    UChar32 c;
    int32_t pos; /* requested UTF-16 index */
    int32_t i; /* UTF-8 index */
    UBool havePos;

    /* calculate the requested UTF-16 index */
    switch(origin) {
    case UITER_ZERO:
    case UITER_START:
        pos=delta;
        havePos=TRUE;
        /* iter->index<0 (unknown) is possible */
        break;
    case UITER_CURRENT:
        if(iter->index>=0) {
            pos=iter->index+delta;
            havePos=TRUE;
        } else {
            /* the current UTF-16 index is unknown after setState(), use only delta */
            pos=0;
            havePos=FALSE;
        }
        break;
    case UITER_LIMIT:
    case UITER_LENGTH:
        if(iter->length>=0) {
            pos=iter->length+delta;
            havePos=TRUE;
        } else {
            /* pin to the end, avoid counting the length */
            iter->index=-1;
            iter->start=iter->limit;
            iter->reservedField=0;
            if(delta>=0) {
                return UITER_UNKNOWN_INDEX;
            } else {
                /* the current UTF-16 index is unknown, use only delta */
                pos=0;
                havePos=FALSE;
            }
        }
        break;
    default:
        return -1;  /* Error */
    }

    if(havePos) {
        /* shortcuts: pinning to the edges of the string */
        if(pos<=0) {
            iter->index=iter->start=iter->reservedField=0;
            return 0;
        } else if(iter->length>=0 && pos>=iter->length) {
            iter->index=iter->length;
            iter->start=iter->limit;
            iter->reservedField=0;
            return iter->index;
        }

        /* minimize the number of U8_NEXT/PREV operations */
        if(iter->index<0 || pos<iter->index/2) {
            /* go forward from the start instead of backward from the current index */
            iter->index=iter->start=iter->reservedField=0;
        } else if(iter->length>=0 && (iter->length-pos)<(pos-iter->index)) {
            /*
             * if we have the UTF-16 index and length and the new position is
             * closer to the end than the current index,
             * then go backward from the end instead of forward from the current index
             */
            iter->index=iter->length;
            iter->start=iter->limit;
            iter->reservedField=0;
        }

        delta=pos-iter->index;
        if(delta==0) {
            return iter->index; /* nothing to do */
        }
    } else {
        /* move relative to unknown UTF-16 index */
        if(delta==0) {
            return UITER_UNKNOWN_INDEX; /* nothing to do */
        } else if(-delta>=iter->start) {
            /* moving backwards by more UChars than there are UTF-8 bytes, pin to 0 */
            iter->index=iter->start=iter->reservedField=0;
            return 0;
        } else if(delta>=(iter->limit-iter->start)) {
            /* moving forward by more UChars than the remaining UTF-8 bytes, pin to the end */
            iter->index=iter->length; /* may or may not be <0 (unknown) */
            iter->start=iter->limit;
            iter->reservedField=0;
            return iter->index>=0 ? iter->index : (int32_t)UITER_UNKNOWN_INDEX;
        }
    }

    /* delta!=0 */

    /* move towards the requested position, pin to the edges of the string */
    s=(const uint8_t *)iter->context;
    pos=iter->index; /* could be <0 (unknown) */
    i=iter->start;
    if(delta>0) {
        /* go forward */
        int32_t limit=iter->limit;
        if(iter->reservedField!=0) {
            iter->reservedField=0;
            ++pos;
            --delta;
        }
        while(delta>0 && i<limit) {
            U8_NEXT_OR_FFFD(s, i, limit, c);
            if(c<=0xffff) {
                ++pos;
                --delta;
            } else if(delta>=2) {
                pos+=2;
                delta-=2;
            } else /* delta==1 */ {
                /* stop in the middle of a supplementary code point */
                iter->reservedField=c;
                ++pos;
                break; /* delta=0; */
            }
        }
        if(i==limit) {
            if(iter->length<0 && iter->index>=0) {
                iter->length= iter->reservedField==0 ? pos : pos+1;
            } else if(iter->index<0 && iter->length>=0) {
                iter->index= iter->reservedField==0 ? iter->length : iter->length-1;
            }
        }
    } else /* delta<0 */ {
        /* go backward */
        if(iter->reservedField!=0) {
            iter->reservedField=0;
            i-=4; /* we stayed behind the supplementary code point; go before it now */
            --pos;
            ++delta;
        }
        while(delta<0 && i>0) {
            U8_PREV_OR_FFFD(s, 0, i, c);
            if(c<=0xffff) {
                --pos;
                ++delta;
            } else if(delta<=-2) {
                pos-=2;
                delta+=2;
            } else /* delta==-1 */ {
                /* stop in the middle of a supplementary code point */
                i+=4; /* back to behind this supplementary code point for consistent state */
                iter->reservedField=c;
                --pos;
                break; /* delta=0; */
            }
        }
    }

    iter->start=i;
    if(iter->index>=0) {
        return iter->index=pos;
    } else {
        /* we started with index<0 (unknown) so pos is bogus */
        if(i<=1) {
            return iter->index=i; /* reached the beginning */
        } else {
            /* we still don't know the UTF-16 index */
            return UITER_UNKNOWN_INDEX;
        }
    }
}